

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbdrec_primaldual_tvl1.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  LBDOperator *LBD;
  int interactive;
  int process_only_fast;
  int optionIndex;
  string filename;
  Mat result;
  Mat testImagef;
  Mat testImage;
  Mat res8;
  stringstream windowNameStr;
  uint local_3ec;
  int local_3e8;
  float local_3e4;
  allocator local_3d5;
  float local_3d4;
  int local_3d0;
  int local_3cc;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  Mat *local_3c0;
  long local_3b8 [2];
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  void *local_388;
  undefined8 uStack_380;
  long local_378;
  Point local_368;
  Size local_360;
  int local_358;
  int local_354;
  _InputArray local_350;
  _OutputArray local_338 [4];
  Mat local_2d8 [96];
  _OutputArray local_278 [4];
  Mat local_218 [96];
  undefined4 local_1b8 [2];
  Mat *local_1b0;
  undefined8 local_1a8 [14];
  ios_base local_138 [264];
  
  if (argc < 2) {
    print_usage(_stdout,argv);
    iVar3 = 0;
  }
  else {
    local_3ec = 0;
    if (main::long_options == '\0') {
      main_cold_1();
    }
    local_3d4 = 10.0;
    local_3e4 = 0.1;
    local_3e8 = 1000;
    iVar3 = 0x20;
    local_3d0 = 0;
    do {
      while( true ) {
        while( true ) {
          while (iVar2 = getopt_long(argc,argv,"i:l:o:p:",main::long_options,&local_3cc),
                __s1 = _optarg, 0x68 < iVar2) {
            switch(iVar2) {
            case 0x69:
              local_3e8 = atoi(_optarg);
              break;
            case 0x6c:
              dVar1 = atof(_optarg);
              local_3e4 = (float)dVar1;
              break;
            case 0x6f:
              local_3d0 = atoi(_optarg);
              break;
            case 0x70:
              iVar3 = atoi(_optarg);
              iVar3 = iVar3 % 2 + iVar3;
            }
          }
          if (iVar2 != 0) break;
          if (local_3cc == 3) {
            dVar1 = atof(_optarg);
            local_3d4 = (float)dVar1;
          }
          else if (local_3cc == 0) {
            iVar2 = strncmp(_optarg,"freak",5);
            local_3ec = 0;
            if (iVar2 != 0) {
              iVar2 = strncmp(__s1,"brief",5);
              local_3ec = 2;
              if (iVar2 != 0) {
                iVar2 = strncmp(__s1,"exfreak",7);
                local_3ec = (uint)(iVar2 == 0) * 2 + 1;
              }
            }
          }
        }
        if (iVar2 != 0x3f) break;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unknown option: -",0x11);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," (ignored)\n",0xb);
      }
    } while (iVar2 != -1);
    std::__cxx11::string::string
              ((string *)&local_3a8,argv[(ulong)(uint)argc - 2],(allocator *)local_1b8);
    cv::imread((string *)local_278,(int)(string *)&local_3a8);
    if (local_278[0].super__InputArray.sz == (Size)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error opening image: ",0x15);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_3a8,local_3a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      print_usage(_stderr,argv);
      iVar3 = 1;
    }
    else {
      cv::Mat::Mat(local_2d8);
      local_1a8[0] = 0;
      local_1b8[0] = 0x2010000;
      local_1b0 = local_2d8;
      cv::Mat::convertTo(local_278,(int)local_1b8,0.00392156862745098,0.0);
      local_368.x = local_3d0;
      if (local_3d0 == 0) {
        local_368.x = iVar3;
      }
      LBD = lts2::CreateLbdOperator(local_3ec,0x200);
      local_358 = iVar3;
      local_354 = iVar3;
      (*(LBD->super_LinearOperator)._vptr_LinearOperator[5])(LBD);
      (LBD->super_LinearOperator)._norm = local_3d4;
      cv::Mat::Mat((Mat *)local_338);
      local_368.y = local_368.x;
      local_360.width = iVar3;
      local_360.height = iVar3;
      lts2::PerformTVL1OnImage
                (local_2d8,&local_360,&local_368,LBD,(Mat *)local_338,local_3e8,local_3e4,0.5);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Primal-Dual (TVL1)",0x12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,&DAT_00114040 + *(int *)(&DAT_00114040 + (ulong)local_3ec * 4)
                 ,*(long *)(&DAT_001141c0 + (ulong)local_3ec * 8));
      cv::Mat::Mat(local_218);
      local_3b8[0] = 0;
      local_3c8 = 0x2010000;
      local_3c0 = local_218;
      cv::Mat::convertTo(local_338,(int)&local_3c8,255.0,0.0);
      std::__cxx11::string::string((string *)&local_3c8,argv[(ulong)(uint)argc - 1],&local_3d5);
      local_350.sz.width = 0;
      local_350.sz.height = 0;
      local_350.flags = 0x1010000;
      local_378 = 0;
      local_388 = (void *)0x0;
      uStack_380 = 0;
      local_350.obj = local_218;
      cv::imwrite((string *)&local_3c8,&local_350,(vector *)&local_388);
      if (local_388 != (void *)0x0) {
        operator_delete(local_388,local_378 - (long)local_388);
      }
      if ((long *)CONCAT44(uStack_3c4,local_3c8) != local_3b8) {
        operator_delete((long *)CONCAT44(uStack_3c4,local_3c8),local_3b8[0] + 1);
      }
      cv::Mat::~Mat(local_218);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      cv::Mat::~Mat((Mat *)local_338);
      cv::Mat::~Mat(local_2d8);
      iVar3 = 0;
    }
    cv::Mat::~Mat((Mat *)local_278);
    if (local_3a8 != local_398) {
      operator_delete(local_3a8,local_398[0] + 1);
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
  if (argc < 2)
  {
    print_usage(stdout, argv);
    return 0;
  }

  int lbdType = 0;
  int pside = 32;
  int iterations = 1000;
  float lambda = 0.1;
  int offset = 0;
  int process_only_fast = 0;
  int interactive = 0;
  float operator_norm = 10.0;

  static struct option long_options[] = {
    {"lbd", required_argument, 0, 0},
    {"fast", no_argument, &process_only_fast, 1},
    {"interactive", no_argument, &interactive, 1},
    {"norm", required_argument, 0, 0},
    {0, 0, 0, 0}
  };

  int optionIndex;
  int c = getopt_long(argc, argv, "i:l:o:p:", long_options, &optionIndex);
  
  while (c != -1)
  {
    switch (c)
    {
    case 0:
      if (optionIndex == 0)
      {
        if (strncmp(optarg, "freak", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeFreak;
        else if (strncmp(optarg, "brief", 5) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeBrief;
        else if (strncmp(optarg, "exfreak", 7) == 0) lbdType = (int)lbd::LBD_TYPE::eTypeExFreak;
        else lbdType = (int)lbd::LBD_TYPE::eTypeRandomFreak;
      }
      if (optionIndex == 3)
      {
        operator_norm = (float)atof(optarg);
      }
      break;
      
    case 'i':
      iterations = atoi(optarg);
      break;

    case 'l':
      lambda = (float)atof(optarg);
      break;

    case 'p':
      pside = atoi(optarg);
      pside += (pside % 2);   // Enforce even size
      break;

    case 'o':
      offset = atoi(optarg);
      break;

    case '?':
      std::cerr << "Unknown option: -" << c << " (ignored)\n";
      break;

    default:
      break;
    }

    c = getopt_long(argc, argv, "i:l:o:p:", long_options, &optionIndex);
  }

  std::string filename = (interactive == 0 ? argv[argc-2] : argv[argc-1]);
  cv::Mat testImage = cv::imread(filename, 0);
  if (!testImage.data)
  {
    std::cerr << "Error opening image: " << filename << std::endl;
    print_usage(stderr, argv);
    return EXIT_FAILURE;
  }

  cv::Mat testImagef;
  testImage.convertTo(testImagef, CV_32F, 1.0/255.0);

  cv::Size patchSize(pside,pside);
  if (offset == 0) offset = pside;
  cv::Point patchOffset(offset,offset);

  lts2::LBDOperator *LBD = lts2::CreateLbdOperator(lbdType);
  LBD->initWithPatchSize(patchSize);
  LBD->setNorm(operator_norm);

  cv::Mat result;

  if (process_only_fast == 0)
    lts2::PerformTVL1OnImage(testImagef, patchSize, patchOffset, *LBD, result, iterations, lambda);
  else
    lts2::PerformTVL1OnImageFAST(testImagef, patchSize, *LBD, result, iterations, lambda);

  std::stringstream windowNameStr;
  windowNameStr << "Primal-Dual (TVL1)" << " ";
  if (process_only_fast != 0)
    windowNameStr << "FAST " << " ";

  switch (lbdType)
  {
  case (int)lbd::LBD_TYPE::eTypeFreak:
    windowNameStr << "FREAK";
    break;

  case (int)lbd::LBD_TYPE::eTypeRandomFreak:
    windowNameStr << "Randomized FREAK";
    break;

  case (int)lbd::LBD_TYPE::eTypeBrief:
    windowNameStr << "BRIEF";
    break;

  case (int)lbd::LBD_TYPE::eTypeExFreak:
    windowNameStr << "Ex-FREAK";
    break;
  }

  cv::Mat res8;
  result.convertTo(res8, CV_8U, 255.0);

  if (interactive > 0)
  {
    cv::imshow(windowNameStr.str(), res8);
    cv::waitKey();
  }
  else cv::imwrite(argv[argc-1], res8);

  return EXIT_SUCCESS;
}